

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O3

void __thiscall dgMeshEffect::BoxMapping(dgMeshEffect *this,HaI32 front,HaI32 side,HaI32 top)

{
  dgRedBackNode **ppdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  int iVar6;
  dgTreeNode *this_00;
  dgBigVector *pdVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  char cVar16;
  int iVar17;
  double *pdVar18;
  dgVertexAtribute *pdVar19;
  uint uVar20;
  HaI32 i;
  int iVar21;
  HaI32 i_00;
  undefined1 auVar26 [16];
  dgRedBackNode *pdVar22;
  dgRedBackNode *pdVar23;
  HaI32 i_01;
  ulong uVar24;
  int iVar25;
  undefined1 auVar28 [32];
  undefined1 auVar27 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  dgStack<dgMeshEffect::dgVertexAtribute> attribArray;
  HaI32 materialArray [3];
  dgBigVector minVal;
  dgBigVector maxVal;
  dgStack<dgMeshEffect::dgVertexAtribute> local_110;
  dgMeshEffect *local_100;
  HaI32 local_f4 [3];
  ulong local_e8;
  double local_e0;
  Iterator local_d8;
  undefined1 local_c8 [16];
  dgTemplateVector<double> local_b8;
  undefined1 local_98 [16];
  double local_88;
  double local_80;
  undefined1 local_78 [16];
  double local_68;
  undefined1 local_58 [16];
  double local_48;
  double local_40;
  undefined1 auVar38 [32];
  
  GetMinMax((dgBigVector *)local_78,(dgBigVector *)local_58,(HaF64 *)this->m_points,
            *(HaI32 *)&(this->super_dgRefCounter).field_0xc,0x20);
  auVar37._8_8_ = local_40;
  auVar37._0_8_ = local_40;
  auVar37._16_8_ = local_40;
  auVar37._24_8_ = local_40;
  local_48 = local_48 - local_68;
  auVar26 = vsubpd_avx(local_58,local_78);
  auVar39._8_8_ = local_48;
  auVar39._0_8_ = local_48;
  auVar39._16_8_ = local_48;
  auVar39._24_8_ = local_48;
  auVar29 = vblendpd_avx(ZEXT1632(auVar26),auVar39,4);
  auVar29 = vblendpd_avx(auVar29,auVar37,8);
  auVar28._8_8_ = 0x7fffffffffffffff;
  auVar28._0_8_ = 0x7fffffffffffffff;
  auVar28._16_8_ = 0x7fffffffffffffff;
  auVar28._24_8_ = 0x7fffffffffffffff;
  auVar28 = vandpd_avx512vl(auVar29,auVar28);
  auVar29._8_8_ = 0x7fefffffffffffff;
  auVar29._0_8_ = 0x7fefffffffffffff;
  auVar29._16_8_ = 0x7fefffffffffffff;
  auVar29._24_8_ = 0x7fefffffffffffff;
  uVar24 = vpcmpgtq_avx512vl(auVar28,auVar29);
  if ((uVar24 & 0xf) != 0) {
LAB_0086589b:
    __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                  ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
  }
  local_e0 = 1.0 / local_48;
  if ((!NAN(local_e0)) && ((long)ABS(local_e0) < 0x7ff0000000000000)) {
    auVar27._8_8_ = 0x3ff0000000000000;
    auVar27._0_8_ = 0x3ff0000000000000;
    local_c8 = vdivpd_avx(auVar27,auVar26);
    auVar26 = vshufpd_avx(local_c8,local_c8,1);
    if (!NAN(auVar26._0_8_)) {
      auVar26._8_8_ = 0x7fffffffffffffff;
      auVar26._0_8_ = 0x7fffffffffffffff;
      auVar26 = vpandq_avx512vl(local_c8,auVar26);
      auVar8._8_8_ = 0x7fefffffffffffff;
      auVar8._0_8_ = 0x7fefffffffffffff;
      uVar24 = vpcmpgtq_avx512vl(auVar26,auVar8);
      if (((uVar24 & 1) == 0) && ((uVar24 & 3) >> 1 == 0)) {
        iVar17 = (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_count;
        local_110.super_dgStackBase.m_ptr = malloc((long)(iVar17 * 0x60));
        local_110.m_size = iVar17;
        if (-1 < iVar17) {
          EnumerateAttributeArray(this,(dgVertexAtribute *)local_110.super_dgStackBase.m_ptr);
          uVar20 = (this->super_dgPolyhedra).m_edgeMark;
          uVar24 = (ulong)uVar20;
          iVar17 = uVar20 + 1;
          (this->super_dgPolyhedra).m_edgeMark = iVar17;
          local_f4[0] = front;
          local_f4[1] = side;
          local_f4[2] = top;
          if (iVar17 == 0x7fffffff) {
            __assert_fail("m_edgeMark < 0x7fffffff",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.h"
                          ,0xe5,"hacd::HaI32 dgPolyhedra::IncLRU() const");
          }
          this_00 = (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_head;
          local_100 = this;
          local_e8 = uVar24;
          local_d8.m_tree = (dgTree<dgEdge,_long> *)this;
          if (this_00 == (dgTreeNode *)0x0) {
            local_d8.m_ptr = (dgRedBackNode *)0x0;
          }
          else {
            local_d8.m_ptr = dgRedBackNode::Minimum(&this_00->super_dgRedBackNode);
          }
          while (local_d8.m_ptr != (dgRedBackNode *)0x0) {
            if (*(int *)&local_d8.m_ptr[2]._vptr_dgRedBackNode <= (int)uVar24) {
              pdVar23 = local_d8.m_ptr[1].m_right;
              iVar25 = *(int *)&local_d8.m_ptr[1]._vptr_dgRedBackNode;
              pdVar22 = local_d8.m_ptr[1].m_parent;
              pdVar7 = this->m_points;
              auVar46._8_8_ = 0x7fffffffffffffff;
              auVar46._0_8_ = 0x7fffffffffffffff;
              auVar46._16_8_ = 0x7fffffffffffffff;
              auVar46._24_8_ = 0x7fffffffffffffff;
              auVar47._8_8_ = 0x7fefffffffffffff;
              auVar47._0_8_ = 0x7fefffffffffffff;
              auVar47._16_8_ = 0x7fefffffffffffff;
              auVar47._24_8_ = 0x7fefffffffffffff;
              iVar21 = *(int *)&pdVar23->_vptr_dgRedBackNode;
              iVar6 = *(int *)&pdVar22->_vptr_dgRedBackNode;
              *(int *)&local_d8.m_ptr[2]._vptr_dgRedBackNode = iVar17;
              *(int *)&pdVar23[1]._vptr_dgRedBackNode = iVar17;
              *(int *)&pdVar22[1]._vptr_dgRedBackNode = iVar17;
              auVar9._0_8_ = pdVar7[iVar25].super_dgTemplateVector<double>.m_x;
              auVar9._8_8_ = pdVar7[iVar25].super_dgTemplateVector<double>.m_y;
              dVar2 = pdVar7[iVar25].super_dgTemplateVector<double>.m_z;
              auVar11._0_8_ = pdVar7[iVar21].super_dgTemplateVector<double>.m_x;
              auVar11._8_8_ = pdVar7[iVar21].super_dgTemplateVector<double>.m_y;
              auVar26 = vsubpd_avx(auVar11,auVar9);
              dVar10 = pdVar7[iVar21].super_dgTemplateVector<double>.m_z - dVar2;
              dVar3 = pdVar7[iVar21].super_dgTemplateVector<double>.m_w;
              auVar31._8_8_ = dVar3;
              auVar31._0_8_ = dVar3;
              auVar31._16_8_ = dVar3;
              auVar31._24_8_ = dVar3;
              auVar42._8_8_ = dVar10;
              auVar42._0_8_ = dVar10;
              auVar42._16_8_ = dVar10;
              auVar42._24_8_ = dVar10;
              auVar29 = vblendpd_avx(ZEXT1632(auVar26),auVar42,4);
              auVar29 = vblendpd_avx(auVar29,auVar31,8);
              auVar29 = vandpd_avx(auVar29,auVar46);
              uVar24 = vpcmpgtq_avx512vl(auVar29,auVar47);
              if ((uVar24 & 0xf) != 0) goto LAB_0086589b;
              auVar12._0_8_ = pdVar7[iVar6].super_dgTemplateVector<double>.m_x;
              auVar12._8_8_ = pdVar7[iVar6].super_dgTemplateVector<double>.m_y;
              auVar27 = vsubpd_avx(auVar12,auVar9);
              dVar2 = pdVar7[iVar6].super_dgTemplateVector<double>.m_z - dVar2;
              dVar4 = pdVar7[iVar6].super_dgTemplateVector<double>.m_w;
              auVar43._8_8_ = dVar4;
              auVar43._0_8_ = dVar4;
              auVar43._16_8_ = dVar4;
              auVar43._24_8_ = dVar4;
              auVar45._8_8_ = dVar2;
              auVar45._0_8_ = dVar2;
              auVar45._16_8_ = dVar2;
              auVar45._24_8_ = dVar2;
              auVar29 = vblendpd_avx(ZEXT1632(auVar27),auVar45,4);
              auVar29 = vblendpd_avx(auVar29,auVar43,8);
              auVar29 = vandpd_avx(auVar29,auVar46);
              uVar24 = vpcmpgtq_avx512vl(auVar29,auVar47);
              if ((uVar24 & 0xf) != 0) goto LAB_0086589b;
              auVar8 = vshufpd_avx(auVar27,auVar27,1);
              auVar9 = vshufpd_avx(auVar26,auVar26,1);
              auVar40._8_8_ = 0;
              auVar40._0_8_ = dVar2;
              auVar44._8_8_ = 0;
              auVar44._0_8_ = auVar8._0_8_ * dVar10;
              auVar11 = vfmsub231sd_fma(auVar44,auVar9,auVar40);
              auVar34._8_8_ = 0;
              auVar34._0_8_ = dVar10;
              auVar41._8_8_ = 0;
              auVar41._0_8_ = dVar2 * auVar26._0_8_;
              auVar12 = vfmsub231sd_fma(auVar41,auVar27,auVar34);
              local_b8.m_x = auVar11._0_8_;
              auVar35._8_8_ = 0;
              auVar35._0_8_ = auVar27._0_8_ * auVar9._0_8_;
              auVar26 = vfmsub231sd_fma(auVar35,auVar26,auVar8);
              local_b8.m_y = auVar12._0_8_;
              local_b8.m_z = auVar26._0_8_;
              local_b8.m_w = dVar3;
              if (((0x7fefffffffffffff < (ulong)ABS(local_b8.m_x)) ||
                  (0x7fefffffffffffff < (ulong)ABS(local_b8.m_y))) ||
                 (0x7fefffffffffffff < (ulong)ABS(local_b8.m_z))) goto LAB_0086589b;
              pdVar23 = local_d8.m_ptr + 1;
              auVar26 = ZEXT816(0) << 0x40;
              iVar21 = 0;
              iVar25 = 0;
              do {
                auVar33._0_8_ = auVar26._0_8_;
                pdVar18 = dgTemplateVector<double>::operator[](&local_b8,iVar21);
                auVar30._8_8_ = 0;
                auVar30._0_8_ = *pdVar18;
                auVar33._8_8_ = 0;
                auVar13._8_8_ = 0x7fffffffffffffff;
                auVar13._0_8_ = 0x7fffffffffffffff;
                auVar27 = vandpd_avx512vl(auVar30,auVar13);
                auVar26 = vmaxsd_avx(auVar27,auVar33);
                if (auVar33._0_8_ < auVar27._0_8_) {
                  iVar25 = iVar21;
                }
                iVar21 = iVar21 + 1;
              } while (iVar21 != 3);
              i_00 = iVar25 + 1 + ((iVar25 + 1) / 3) * -3;
              cVar16 = (char)i_00 + '\x01';
              uVar20 = cVar16 * 0x56;
              i_01 = (HaI32)(char)(cVar16 + ((char)((uVar20 & 0xffff) >> 0xf) + (char)(uVar20 >> 8))
                                            * -3);
              if (iVar25 == 1) {
                i_00 = i_01;
              }
              pdVar22 = pdVar23;
              if (iVar25 == 1) {
                i_01 = 2;
              }
              do {
                pdVar19 = dgStack<dgMeshEffect::dgVertexAtribute>::operator[]
                                    (&local_110,*(HaI32 *)&pdVar22->m_left);
                pdVar7 = local_100->m_points;
                iVar21 = *(int *)&pdVar22->_vptr_dgRedBackNode;
                auVar5._0_8_ = pdVar7[iVar21].super_dgTemplateVector<double>.m_x;
                auVar5._8_8_ = pdVar7[iVar21].super_dgTemplateVector<double>.m_y;
                dVar2 = pdVar7[iVar21].super_dgTemplateVector<double>.m_w;
                auVar36._8_8_ = dVar2;
                auVar36._0_8_ = dVar2;
                auVar38._16_8_ = dVar2;
                auVar38._0_16_ = auVar36;
                auVar38._24_8_ = dVar2;
                auVar26 = vsubpd_avx(auVar5,local_78);
                local_98._0_8_ = auVar26._0_8_ * (double)local_c8._0_8_;
                local_98._8_8_ = auVar26._8_8_ * (double)local_c8._8_8_;
                local_88 = (pdVar7[iVar21].super_dgTemplateVector<double>.m_z - local_68) * local_e0
                ;
                auVar32._8_8_ = local_88;
                auVar32._0_8_ = local_88;
                auVar32._16_8_ = local_88;
                auVar32._24_8_ = local_88;
                local_80 = (double)vmovlpd_avx(auVar36);
                auVar29 = vblendpd_avx(ZEXT1632(local_98),auVar32,4);
                auVar29 = vblendpd_avx(auVar29,auVar38,8);
                auVar14._8_8_ = 0x7fffffffffffffff;
                auVar14._0_8_ = 0x7fffffffffffffff;
                auVar14._16_8_ = 0x7fffffffffffffff;
                auVar14._24_8_ = 0x7fffffffffffffff;
                auVar29 = vandpd_avx512vl(auVar29,auVar14);
                auVar15._8_8_ = 0x7fefffffffffffff;
                auVar15._0_8_ = 0x7fefffffffffffff;
                auVar15._16_8_ = 0x7fefffffffffffff;
                auVar15._24_8_ = 0x7fefffffffffffff;
                uVar24 = vpcmpgtq_avx512vl(auVar29,auVar15);
                if ((uVar24 & 0xf) != 0) goto LAB_0086589b;
                pdVar18 = dgTemplateVector<double>::operator[]
                                    ((dgTemplateVector<double> *)local_98,i_00);
                pdVar19->m_u0 = (HaF64)*pdVar18;
                pdVar18 = dgTemplateVector<double>::operator[]
                                    ((dgTemplateVector<double> *)local_98,i_01);
                pdVar19->m_v0 = (HaF64)*pdVar18;
                pdVar19->m_u1 = 0.0;
                pdVar19->m_v1 = 0.0;
                pdVar19->m_material = (HaF64)(double)local_f4[iVar25];
                ppdVar1 = &pdVar22->m_right;
                this = local_100;
                pdVar22 = *ppdVar1;
                uVar24 = local_e8;
              } while (*ppdVar1 != pdVar23);
            }
            dgTree<dgEdge,_long>::Iterator::operator++(&local_d8,0);
          }
          if (-1 < local_110.m_size) {
            ApplyAttributeArray(this,(dgVertexAtribute *)local_110.super_dgStackBase.m_ptr);
            free(local_110.super_dgStackBase.m_ptr);
            return;
          }
        }
        __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                      ,0x60,
                      "T &dgStack<dgMeshEffect::dgVertexAtribute>::operator[](hacd::HaI32) [T = dgMeshEffect::dgVertexAtribute]"
                     );
      }
    }
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x159,
                "dgBigVector::dgBigVector(hacd::HaF64, hacd::HaF64, hacd::HaF64, hacd::HaF64)");
}

Assistant:

void dgMeshEffect::BoxMapping (hacd::HaI32 front, hacd::HaI32 side, hacd::HaI32 top)
{
	dgBigVector minVal;
	dgBigVector maxVal;
	hacd::HaI32 materialArray[3];

	GetMinMax (minVal, maxVal, &m_points[0][0], m_pointCount, sizeof (dgBigVector));
	dgBigVector dist (maxVal - minVal);
	dgBigVector scale (hacd::HaF64 (1.0f)/ dist[0], hacd::HaF64 (1.0f)/ dist[1], hacd::HaF64 (1.0f)/ dist[2], hacd::HaF64 (0.0f));

	dgStack<dgVertexAtribute>attribArray (GetCount());
	EnumerateAttributeArray (&attribArray[0]);

	materialArray[0] = front;
	materialArray[1] = side;
	materialArray[2] = top;

	hacd::HaI32 mark = IncLRU();
	dgPolyhedra::Iterator iter (*this);	
	for(iter.Begin(); iter; iter ++){
		dgEdge* const edge = &(*iter);
		if (edge->m_mark < mark){
			const dgBigVector& p0 = m_points[edge->m_incidentVertex];
			const dgBigVector& p1 = m_points[edge->m_next->m_incidentVertex];
			const dgBigVector& p2 = m_points[edge->m_prev->m_incidentVertex];

			edge->m_mark = mark;
			edge->m_next->m_mark = mark;
			edge->m_prev->m_mark = mark;

			dgBigVector e0 (p1 - p0);
			dgBigVector e1 (p2 - p0);
			dgBigVector n (e0 * e1);
			
			hacd::HaI32 index = 0;
			hacd::HaF64 maxProjection = hacd::HaF32 (0.0f);

			for (hacd::HaI32 i = 0; i < 3; i ++) {
				hacd::HaF64 proj = fabs (n[i]);
				if (proj > maxProjection) {
					index = i;
					maxProjection = proj;
				}
			}

			hacd::HaI32 u = (index + 1) % 3;
			hacd::HaI32 v = (u + 1) % 3;
			if (index == 1) {
				Swap (u, v);
			}
			dgEdge* ptr = edge;
			do {
				dgVertexAtribute& attrib = attribArray[hacd::HaI32 (ptr->m_userData)];
				dgBigVector p (scale.CompProduct(m_points[ptr->m_incidentVertex] - minVal));
				attrib.m_u0 = p[u];
				attrib.m_v0 = p[v];
				attrib.m_u1 = hacd::HaF64(0.0f);
				attrib.m_v1 = hacd::HaF64(0.0f);
				attrib.m_material = materialArray[index];

				ptr = ptr->m_next;
			}while (ptr !=  edge);
		}
	}

	ApplyAttributeArray (&attribArray[0]);
}